

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

pid_t testing::internal::ExecDeathTestSpawnChild(char **argv,int close_fd)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  char *in_stack_fffffffffffff830;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff838;
  bool local_7a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff868;
  int local_774;
  string local_770;
  allocator<char> local_749;
  string local_748 [32];
  string local_728 [32];
  string local_708 [32];
  string local_6e8 [32];
  string local_6c8 [32];
  string local_6a8;
  int local_684;
  string local_680;
  undefined1 local_659 [33];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598;
  int local_578;
  int local_574;
  int gtest_retval_1;
  allocator<char> local_549;
  string local_548 [32];
  string local_528 [32];
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8;
  int local_484;
  string local_480;
  allocator<char> local_459;
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8;
  _Alloc_hider *local_398;
  void *stack_top;
  size_t kMaxStackAlignment;
  string local_380;
  allocator<char> local_359;
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_298;
  void *stack;
  size_t stack_size;
  undefined1 local_280 [3];
  bool use_fork;
  allocator<char> local_249;
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188;
  int local_164;
  _union_1457 _Stack_160;
  int gtest_retval;
  sigaction ignore_sigprof_action;
  sigaction saved_sigprof_action;
  char **ppcStack_28;
  pid_t child_pid;
  ExecDeathTestArgs args;
  int close_fd_local;
  char **argv_local;
  
  saved_sigprof_action.sa_restorer._4_4_ = -1;
  ppcStack_28 = argv;
  args.argv._0_4_ = close_fd;
  args._12_4_ = close_fd;
  memset(&stack0xfffffffffffffea0,0,0x98);
  sigemptyset((sigset_t *)&ignore_sigprof_action);
  _Stack_160 = (_union_1457)0x1;
  do {
    do {
      local_164 = sigaction(0x1b,(sigaction *)&stack0xfffffffffffffea0,
                            (sigaction *)&ignore_sigprof_action.sa_restorer);
      bVar3 = false;
      if (local_164 == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (local_164 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_248,"CHECK failed: File ",&local_249)
      ;
      std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
      std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
      stack_size._4_4_ = 0x501;
      StreamableToString<int>((string *)local_280,(int *)((long)&stack_size + 4));
      std::operator+(in_stack_fffffffffffff868,in_stack_fffffffffffff860);
      std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
      std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
      std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
      DeathTestAbort(&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string(local_1a8);
      std::__cxx11::string::~string(local_1c8);
      std::__cxx11::string::~string(local_1e8);
      std::__cxx11::string::~string((string *)local_280);
      std::__cxx11::string::~string(local_208);
      std::__cxx11::string::~string(local_228);
      std::__cxx11::string::~string(local_248);
      std::allocator<char>::~allocator(&local_249);
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  stack_size._3_1_ = FLAGS_gtest_death_test_use_fork & 1;
  if (stack_size._3_1_ == 0) {
    if ((ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') &&
       (iVar1 = __cxa_guard_acquire(&ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down),
       iVar1 != 0)) {
      ExecDeathTestSpawnChild::stack_grows_down = StackGrowsDown();
      __cxa_guard_release(&ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down);
    }
    iVar1 = getpagesize();
    stack = (void *)(long)iVar1;
    local_298 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                mmap((void *)0x0,(size_t)stack,3,0x22,-1,0);
    do {
      bVar3 = IsTrue(local_298 !=
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     0xffffffffffffffff);
      if (!bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_358,"CHECK failed: File ",&local_359);
        std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
        std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
        kMaxStackAlignment._4_4_ = 0x50d;
        StreamableToString<int>(&local_380,(int *)((long)&kMaxStackAlignment + 4));
        std::operator+(in_stack_fffffffffffff868,in_stack_fffffffffffff860);
        std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
        std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
        DeathTestAbort(&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string(local_2d8);
        std::__cxx11::string::~string(local_2f8);
        std::__cxx11::string::~string((string *)&local_380);
        std::__cxx11::string::~string(local_318);
        std::__cxx11::string::~string(local_338);
        std::__cxx11::string::~string(local_358);
        std::allocator<char>::~allocator(&local_359);
      }
      bVar3 = AlwaysFalse();
    } while (bVar3);
    stack_top = (void *)0x40;
    if ((ExecDeathTestSpawnChild::stack_grows_down & 1U) == 0) {
      in_stack_fffffffffffff860 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      in_stack_fffffffffffff860 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)stack + -0x40);
    }
    local_398 = &in_stack_fffffffffffff860->_M_dataplus + (long)&local_298->_M_dataplus;
    in_stack_fffffffffffff868 = local_298;
    do {
      local_7a1 = (void *)0x40 < stack && ((ulong)local_398 & 0x3f) == 0;
      bVar3 = IsTrue(local_7a1);
      if (!bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_458,"CHECK failed: File ",&local_459);
        std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
        std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
        local_484 = 0x51a;
        StreamableToString<int>(&local_480,&local_484);
        std::operator+(in_stack_fffffffffffff868,in_stack_fffffffffffff860);
        std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
        std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
        DeathTestAbort(&local_3b8);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::__cxx11::string::~string(local_3d8);
        std::__cxx11::string::~string(local_3f8);
        std::__cxx11::string::~string((string *)&local_480);
        std::__cxx11::string::~string(local_418);
        std::__cxx11::string::~string(local_438);
        std::__cxx11::string::~string(local_458);
        std::allocator<char>::~allocator(&local_459);
      }
      bVar3 = AlwaysFalse();
    } while (bVar3);
    saved_sigprof_action.sa_restorer._4_4_ =
         clone(ExecDeathTestChildMain,local_398,0x11,&stack0xffffffffffffffd8);
    do {
      iVar1 = munmap(local_298,(size_t)stack);
      bVar3 = IsTrue(iVar1 != -1);
      if (!bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_548,"CHECK failed: File ",&local_549);
        std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
        std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
        local_574 = 0x51e;
        StreamableToString<int>((string *)&gtest_retval_1,&local_574);
        std::operator+(in_stack_fffffffffffff868,in_stack_fffffffffffff860);
        std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
        std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
        DeathTestAbort(&local_4a8);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::__cxx11::string::~string(local_4c8);
        std::__cxx11::string::~string(local_4e8);
        std::__cxx11::string::~string((string *)&gtest_retval_1);
        std::__cxx11::string::~string(local_508);
        std::__cxx11::string::~string(local_528);
        std::__cxx11::string::~string(local_548);
        std::allocator<char>::~allocator(&local_549);
      }
      bVar3 = AlwaysFalse();
    } while (bVar3);
  }
  if (((stack_size._3_1_ & 1) != 0) &&
     (saved_sigprof_action.sa_restorer._4_4_ = fork(), saved_sigprof_action.sa_restorer._4_4_ == 0))
  {
    ExecDeathTestChildMain(&stack0xffffffffffffffd8);
    _exit(0);
  }
  do {
    do {
      local_578 = sigaction(0x1b,(sigaction *)&ignore_sigprof_action.sa_restorer,(sigaction *)0x0);
      bVar3 = false;
      if (local_578 == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (local_578 == -1) {
      in_stack_fffffffffffff838 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_659;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_659 + 1),"CHECK failed: File ",
                 (allocator<char> *)in_stack_fffffffffffff838);
      std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
      std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
      local_684 = 0x52b;
      StreamableToString<int>(&local_680,&local_684);
      std::operator+(in_stack_fffffffffffff868,in_stack_fffffffffffff860);
      std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
      std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
      std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
      DeathTestAbort(&local_598);
      std::__cxx11::string::~string((string *)&local_598);
      std::__cxx11::string::~string(local_5b8);
      std::__cxx11::string::~string(local_5d8);
      std::__cxx11::string::~string(local_5f8);
      std::__cxx11::string::~string((string *)&local_680);
      std::__cxx11::string::~string(local_618);
      std::__cxx11::string::~string(local_638);
      std::__cxx11::string::~string((string *)(local_659 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_659);
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  do {
    bVar3 = IsTrue(saved_sigprof_action.sa_restorer._4_4_ != -1);
    if (!bVar3) {
      __a = &local_749;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_748,"CHECK failed: File ",__a);
      std::operator+(in_stack_fffffffffffff838,(char *)__a);
      std::operator+(in_stack_fffffffffffff838,(char *)__a);
      local_774 = 0x52e;
      StreamableToString<int>(&local_770,&local_774);
      std::operator+(in_stack_fffffffffffff868,in_stack_fffffffffffff860);
      std::operator+(in_stack_fffffffffffff838,(char *)__a);
      std::operator+(in_stack_fffffffffffff838,(char *)__a);
      DeathTestAbort(&local_6a8);
      std::__cxx11::string::~string((string *)&local_6a8);
      std::__cxx11::string::~string(local_6c8);
      std::__cxx11::string::~string(local_6e8);
      std::__cxx11::string::~string((string *)&local_770);
      std::__cxx11::string::~string(local_708);
      std::__cxx11::string::~string(local_728);
      std::__cxx11::string::~string(local_748);
      std::allocator<char>::~allocator(&local_749);
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  return saved_sigprof_action.sa_restorer._4_4_;
}

Assistant:

static pid_t ExecDeathTestSpawnChild(char* const* argv, int close_fd) {
  ExecDeathTestArgs args = { argv, close_fd };
  pid_t child_pid = -1;

#  if GTEST_OS_QNX
  // Obtains the current directory and sets it to be closed in the child
  // process.
  const int cwd_fd = open(".", O_RDONLY);
  GTEST_DEATH_TEST_CHECK_(cwd_fd != -1);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(fcntl(cwd_fd, F_SETFD, FD_CLOEXEC));
  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(std::string("chdir(\"") + original_dir + "\") failed: " +
                   GetLastErrnoDescription());
    return EXIT_FAILURE;
  }

  int fd_flags;
  // Set close_fd to be closed after spawn.
  GTEST_DEATH_TEST_CHECK_SYSCALL_(fd_flags = fcntl(close_fd, F_GETFD));
  GTEST_DEATH_TEST_CHECK_SYSCALL_(fcntl(close_fd, F_SETFD,
                                        fd_flags | FD_CLOEXEC));
  struct inheritance inherit = {0};
  // spawn is a system call.
  child_pid = spawn(args.argv[0], 0, NULL, &inherit, args.argv, GetEnviron());
  // Restores the current working directory.
  GTEST_DEATH_TEST_CHECK_(fchdir(cwd_fd) != -1);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(cwd_fd));

#  else   // GTEST_OS_QNX
#   if GTEST_OS_LINUX
  // When a SIGPROF signal is received while fork() or clone() are executing,
  // the process may hang. To avoid this, we ignore SIGPROF here and re-enable
  // it after the call to fork()/clone() is complete.
  struct sigaction saved_sigprof_action;
  struct sigaction ignore_sigprof_action;
  memset(&ignore_sigprof_action, 0, sizeof(ignore_sigprof_action));
  sigemptyset(&ignore_sigprof_action.sa_mask);
  ignore_sigprof_action.sa_handler = SIG_IGN;
  GTEST_DEATH_TEST_CHECK_SYSCALL_(sigaction(
      SIGPROF, &ignore_sigprof_action, &saved_sigprof_action));
#   endif  // GTEST_OS_LINUX

#   if GTEST_HAS_CLONE
  const bool use_fork = GTEST_FLAG(death_test_use_fork);

  if (!use_fork) {
    static const bool stack_grows_down = StackGrowsDown();
    const size_t stack_size = getpagesize();
    // MMAP_ANONYMOUS is not defined on Mac, so we use MAP_ANON instead.
    void* const stack = mmap(NULL, stack_size, PROT_READ | PROT_WRITE,
                             MAP_ANON | MAP_PRIVATE, -1, 0);
    GTEST_DEATH_TEST_CHECK_(stack != MAP_FAILED);

    // Maximum stack alignment in bytes:  For a downward-growing stack, this
    // amount is subtracted from size of the stack space to get an address
    // that is within the stack space and is aligned on all systems we care
    // about.  As far as I know there is no ABI with stack alignment greater
    // than 64.  We assume stack and stack_size already have alignment of
    // kMaxStackAlignment.
    const size_t kMaxStackAlignment = 64;
    void* const stack_top =
        static_cast<char*>(stack) +
            (stack_grows_down ? stack_size - kMaxStackAlignment : 0);
    GTEST_DEATH_TEST_CHECK_(stack_size > kMaxStackAlignment &&
        reinterpret_cast<intptr_t>(stack_top) % kMaxStackAlignment == 0);

    child_pid = clone(&ExecDeathTestChildMain, stack_top, SIGCHLD, &args);

    GTEST_DEATH_TEST_CHECK_(munmap(stack, stack_size) != -1);
  }
#   else
  const bool use_fork = true;
#   endif  // GTEST_HAS_CLONE

  if (use_fork && (child_pid = fork()) == 0) {
      ExecDeathTestChildMain(&args);
      _exit(0);
  }
#  endif  // GTEST_OS_QNX
#  if GTEST_OS_LINUX
  GTEST_DEATH_TEST_CHECK_SYSCALL_(
      sigaction(SIGPROF, &saved_sigprof_action, NULL));
#  endif  // GTEST_OS_LINUX

  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  return child_pid;
}